

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

UBool hasFullCompositionExclusion(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  bool bVar1;
  uint16_t uVar2;
  Normalizer2Impl *this;
  UErrorCode errorCode;
  UErrorCode local_1c;
  
  local_1c = U_ZERO_ERROR;
  this = icu_63::Normalizer2Factory::getNFCImpl(&local_1c);
  if (local_1c < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar2 = icu_63::Normalizer2Impl::getNorm16(this,c);
    bVar1 = uVar2 < this->minMaybeYes && this->minNoNo <= uVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static UBool hasFullCompositionExclusion(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    // By definition, Full_Composition_Exclusion is the same as NFC_QC=No.
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    return U_SUCCESS(errorCode) && impl->isCompNo(impl->getNorm16(c));
}